

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_teebuf.hpp
# Opt level: O3

void __thiscall
OpenMD::basic_teebuf<char,std::char_traits<char>>::
basic_teebuf<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>>
          (basic_teebuf<char,std::char_traits<char>> *this,
          __normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
          begin,__normal_iterator<std::basic_streambuf<char,_std::char_traits<char>_>_**,_std::vector<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>_>
                end)

{
  allocator_type local_29;
  
  *(code **)this = std::istream::_M_extract<double>;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  std::locale::locale((locale *)(this + 0x38));
  *(undefined ***)this = &PTR__basic_teebuf_002fc538;
  std::vector<std::streambuf*,std::allocator<std::streambuf*>>::
  vector<__gnu_cxx::__normal_iterator<std::streambuf**,std::vector<std::streambuf*,std::allocator<std::streambuf*>>>,void>
            ((vector<std::streambuf*,std::allocator<std::streambuf*>> *)(this + 0x40),begin,end,
             &local_29);
  return;
}

Assistant:

basic_teebuf(ForwardIterator begin, ForwardIterator end) :
        buffers_(begin, end) {}